

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_averages_and_directions.cpp
# Opt level: O3

void compute_avgs_and_dirs_3_comp_rgb(partition_info *pi,image_block *blk,partition_metrics *pm)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  ulong uVar7;
  uint uVar8;
  uint8_t (*pauVar9) [216];
  uint i;
  ulong uVar10;
  ulong uVar11;
  uint i_3;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar19;
  undefined1 auVar18 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined4 uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  vfloat4 partition_averages [4];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined1 uStack_55;
  undefined1 uStack_54;
  undefined1 uStack_53;
  undefined1 uStack_52;
  undefined1 uStack_51;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined1 local_28 [32];
  
  uVar3 = pi->partition_count;
  uVar7 = (ulong)uVar3;
  if (uVar7 == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                  ,0x23e,
                  "void compute_avgs_and_dirs_3_comp_rgb(const partition_info &, const image_block &, partition_metrics *)"
                 );
  }
  bVar1 = blk->texel_count;
  uVar11 = (ulong)bVar1;
  if (bVar1 == 0) {
    __assert_fail("texel_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                  ,0x36,
                  "void compute_partition_averages_rgb(const partition_info &, const image_block &, vfloat4 *)"
                 );
  }
  if (uVar7 == 1) {
    local_98 = vblendps_avx(ZEXT816(0) << 0x40,*(undefined1 (*) [16])(blk->data_mean).m,7);
  }
  else {
    uVar8 = CONCAT31(0,bVar1);
    if (uVar3 == 2) {
      auVar43[4] = bVar1;
      auVar43._0_4_ = uVar8;
      auVar43._5_3_ = 0;
      auVar43[8] = bVar1;
      auVar43._9_3_ = 0;
      auVar43[0xc] = bVar1;
      auVar43._13_3_ = 0;
      auVar43[0x10] = bVar1;
      auVar43._17_3_ = 0;
      auVar43[0x14] = bVar1;
      auVar43._21_3_ = 0;
      auVar43[0x18] = bVar1;
      auVar43._25_3_ = 0;
      auVar43[0x1c] = bVar1;
      auVar43._29_3_ = 0;
      auVar4 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar73._8_4_ = 8;
      auVar73._0_8_ = 0x800000008;
      auVar73._12_4_ = 8;
      auVar73._16_4_ = 8;
      auVar73._20_4_ = 8;
      auVar73._24_4_ = 8;
      auVar73._28_4_ = 8;
      uVar10 = 0;
      auVar18 = ZEXT1664((undefined1  [16])0x0);
      auVar26 = ZEXT816(0);
      auVar58 = ZEXT816(0);
      do {
        auVar5 = vpcmpgtd_avx2(auVar43,auVar4);
        auVar75._8_8_ = 0;
        auVar75._0_8_ = *(ulong *)(pi->partition_of_texel + uVar10);
        auVar14 = vpcmpeqb_avx(auVar75,(undefined1  [16])0x0);
        auVar56 = vpmovsxbd_avx2(auVar14);
        auVar5 = vpand_avx2(auVar5,auVar56);
        auVar56 = vpand_avx2(auVar5,*(undefined1 (*) [32])(blk->data_r + uVar10));
        auVar4 = vpaddd_avx2(auVar4,auVar73);
        fVar57 = auVar58._4_4_;
        fVar19 = auVar58._8_4_;
        fVar20 = auVar58._12_4_;
        auVar58._0_4_ = auVar56._16_4_ + auVar56._0_4_ + auVar58._0_4_;
        auVar58._4_4_ = auVar56._20_4_ + auVar56._4_4_ + fVar57;
        auVar58._8_4_ = auVar56._24_4_ + auVar56._8_4_ + fVar19;
        auVar58._12_4_ = auVar56._28_4_ + auVar56._12_4_ + fVar20;
        auVar56 = vpand_avx2(auVar5,*(undefined1 (*) [32])(blk->data_g + uVar10));
        fVar57 = auVar26._4_4_;
        fVar19 = auVar26._8_4_;
        fVar20 = auVar26._12_4_;
        auVar26._0_4_ = auVar56._16_4_ + auVar56._0_4_ + auVar26._0_4_;
        auVar26._4_4_ = auVar56._20_4_ + auVar56._4_4_ + fVar57;
        auVar26._8_4_ = auVar56._24_4_ + auVar56._8_4_ + fVar19;
        auVar26._12_4_ = auVar56._28_4_ + auVar56._12_4_ + fVar20;
        auVar5 = vpand_avx2(auVar5,*(undefined1 (*) [32])(blk->data_b + uVar10));
        auVar14._0_4_ = auVar5._16_4_ + auVar18._0_4_ + auVar5._0_4_;
        auVar14._4_4_ = auVar5._20_4_ + auVar18._4_4_ + auVar5._4_4_;
        auVar14._8_4_ = auVar5._24_4_ + auVar18._8_4_ + auVar5._8_4_;
        auVar14._12_4_ = auVar5._28_4_ + auVar18._12_4_ + auVar5._12_4_;
        auVar18 = ZEXT1664(auVar14);
        uVar10 = uVar10 + 8;
      } while (uVar10 < uVar11);
      fVar57 = (float)uVar8;
      auVar15 = vpblendd_avx2((undefined1  [16])0x0,*(undefined1 (*) [16])(blk->data_mean).m,7);
      auVar75 = vshufpd_avx(auVar58,auVar58,1);
      auVar50._0_4_ = auVar58._0_4_ + auVar75._0_4_;
      auVar50._4_4_ = auVar58._4_4_ + auVar75._4_4_;
      auVar50._8_4_ = auVar58._8_4_ + auVar75._8_4_;
      auVar50._12_4_ = auVar58._12_4_ + auVar75._12_4_;
      auVar58 = vhaddps_avx(auVar50,auVar50);
      auVar75 = vshufpd_avx(auVar26,auVar26,1);
      auVar27._0_4_ = auVar26._0_4_ + auVar75._0_4_;
      auVar27._4_4_ = auVar26._4_4_ + auVar75._4_4_;
      auVar27._8_4_ = auVar26._8_4_ + auVar75._8_4_;
      auVar27._12_4_ = auVar26._12_4_ + auVar75._12_4_;
      auVar26 = vhaddps_avx(auVar27,auVar27);
      auVar39._0_4_ = fVar57 * auVar15._0_4_;
      auVar39._4_4_ = fVar57 * auVar15._4_4_;
      auVar39._8_4_ = fVar57 * auVar15._8_4_;
      auVar39._12_4_ = fVar57 * auVar15._12_4_;
      auVar58 = vinsertps_avx(auVar58,auVar26,0x1c);
      auVar26 = vshufpd_avx(auVar14,auVar14,1);
      auVar15._0_4_ = auVar14._0_4_ + auVar26._0_4_;
      auVar15._4_4_ = auVar14._4_4_ + auVar26._4_4_;
      auVar15._8_4_ = auVar14._8_4_ + auVar26._8_4_;
      auVar15._12_4_ = auVar14._12_4_ + auVar26._12_4_;
      auVar26 = vhaddps_avx(auVar15,auVar15);
      fVar57 = (float)pi->partition_texel_count[0];
      auVar26 = vblendps_avx(auVar58,auVar26,4);
      auVar28._4_4_ = fVar57;
      auVar28._0_4_ = fVar57;
      auVar28._8_4_ = fVar57;
      auVar28._12_4_ = fVar57;
      local_98 = vdivps_avx(auVar26,auVar28);
      auVar29._0_4_ = (float)pi->partition_texel_count[1];
      auVar26 = vsubps_avx(auVar39,auVar26);
      auVar29._4_4_ = auVar29._0_4_;
      auVar29._8_4_ = auVar29._0_4_;
      auVar29._12_4_ = auVar29._0_4_;
      local_88 = vdivps_avx(auVar26,auVar29);
    }
    else if (uVar3 == 3) {
      auVar56[4] = bVar1;
      auVar56._0_4_ = uVar8;
      auVar56._5_3_ = 0;
      auVar56[8] = bVar1;
      auVar56._9_3_ = 0;
      auVar56[0xc] = bVar1;
      auVar56._13_3_ = 0;
      auVar56[0x10] = bVar1;
      auVar56._17_3_ = 0;
      auVar56[0x14] = bVar1;
      auVar56._21_3_ = 0;
      auVar56[0x18] = bVar1;
      auVar56._25_3_ = 0;
      auVar56[0x1c] = bVar1;
      auVar56._29_3_ = 0;
      auVar4 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      uVar10 = 0;
      auVar77._8_4_ = 8;
      auVar77._0_8_ = 0x800000008;
      auVar77._12_4_ = 8;
      auVar77._16_4_ = 8;
      auVar77._20_4_ = 8;
      auVar77._24_4_ = 8;
      auVar77._28_4_ = 8;
      auVar78[8] = 1;
      auVar78._0_8_ = 0x101010101010101;
      auVar78[9] = 1;
      auVar78[10] = 1;
      auVar78[0xb] = 1;
      auVar78[0xc] = 1;
      auVar78[0xd] = 1;
      auVar78[0xe] = 1;
      auVar78[0xf] = 1;
      auVar18 = ZEXT1664((undefined1  [16])0x0);
      auVar21 = ZEXT816(0);
      auVar37 = ZEXT816(0);
      auVar44 = ZEXT816(0);
      auVar66 = ZEXT816(0);
      auVar80 = ZEXT816(0);
      do {
        auVar73 = vpcmpgtd_avx2(auVar56,auVar4);
        auVar4 = vpaddd_avx2(auVar77,auVar4);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = *(ulong *)(pi->partition_of_texel + uVar10);
        auVar26 = vpcmpeqb_avx(auVar83,(undefined1  [16])0x0);
        auVar43 = vpmovsxbd_avx2(auVar26);
        auVar43 = vpand_avx2(auVar43,auVar73);
        auVar26 = vpcmpeqb_avx(auVar83,auVar78);
        auVar5 = vpmovsxbd_avx2(auVar26);
        auVar73 = vpand_avx2(auVar5,auVar73);
        auVar5 = vpand_avx2(auVar43,*(undefined1 (*) [32])(blk->data_r + uVar10));
        fVar57 = auVar80._4_4_;
        fVar19 = auVar80._8_4_;
        fVar20 = auVar80._12_4_;
        auVar80._0_4_ = auVar5._16_4_ + auVar80._0_4_ + auVar5._0_4_;
        auVar80._4_4_ = auVar5._20_4_ + fVar57 + auVar5._4_4_;
        auVar80._8_4_ = auVar5._24_4_ + fVar19 + auVar5._8_4_;
        auVar80._12_4_ = auVar5._28_4_ + fVar20 + auVar5._12_4_;
        auVar5 = vpand_avx2(auVar73,*(undefined1 (*) [32])(blk->data_r + uVar10));
        fVar57 = auVar37._4_4_;
        fVar19 = auVar37._8_4_;
        fVar20 = auVar37._12_4_;
        auVar37._0_4_ = auVar5._16_4_ + auVar5._0_4_ + auVar37._0_4_;
        auVar37._4_4_ = auVar5._20_4_ + auVar5._4_4_ + fVar57;
        auVar37._8_4_ = auVar5._24_4_ + auVar5._8_4_ + fVar19;
        auVar37._12_4_ = auVar5._28_4_ + auVar5._12_4_ + fVar20;
        auVar5 = vpand_avx2(auVar43,*(undefined1 (*) [32])(blk->data_g + uVar10));
        fVar57 = auVar66._4_4_;
        fVar19 = auVar66._8_4_;
        fVar20 = auVar66._12_4_;
        auVar66._0_4_ = auVar5._16_4_ + auVar5._0_4_ + auVar66._0_4_;
        auVar66._4_4_ = auVar5._20_4_ + auVar5._4_4_ + fVar57;
        auVar66._8_4_ = auVar5._24_4_ + auVar5._8_4_ + fVar19;
        auVar66._12_4_ = auVar5._28_4_ + auVar5._12_4_ + fVar20;
        auVar5 = vpand_avx2(auVar73,*(undefined1 (*) [32])(blk->data_g + uVar10));
        fVar57 = auVar21._4_4_;
        fVar19 = auVar21._8_4_;
        fVar20 = auVar21._12_4_;
        auVar21._0_4_ = auVar5._16_4_ + auVar5._0_4_ + auVar21._0_4_;
        auVar21._4_4_ = auVar5._20_4_ + auVar5._4_4_ + fVar57;
        auVar21._8_4_ = auVar5._24_4_ + auVar5._8_4_ + fVar19;
        auVar21._12_4_ = auVar5._28_4_ + auVar5._12_4_ + fVar20;
        auVar43 = vpand_avx2(auVar43,*(undefined1 (*) [32])(blk->data_b + uVar10));
        fVar57 = auVar44._4_4_;
        fVar19 = auVar44._8_4_;
        fVar20 = auVar44._12_4_;
        auVar44._0_4_ = auVar43._16_4_ + auVar43._0_4_ + auVar44._0_4_;
        auVar44._4_4_ = auVar43._20_4_ + auVar43._4_4_ + fVar57;
        auVar44._8_4_ = auVar43._24_4_ + auVar43._8_4_ + fVar19;
        auVar44._12_4_ = auVar43._28_4_ + auVar43._12_4_ + fVar20;
        auVar43 = vpand_avx2(auVar73,*(undefined1 (*) [32])(blk->data_b + uVar10));
        auVar12._0_4_ = auVar43._16_4_ + auVar43._0_4_ + auVar18._0_4_;
        auVar12._4_4_ = auVar43._20_4_ + auVar43._4_4_ + auVar18._4_4_;
        auVar12._8_4_ = auVar43._24_4_ + auVar43._8_4_ + auVar18._8_4_;
        auVar12._12_4_ = auVar43._28_4_ + auVar43._12_4_ + auVar18._12_4_;
        auVar18 = ZEXT1664(auVar12);
        uVar10 = uVar10 + 8;
      } while (uVar10 < uVar11);
      fVar57 = (float)uVar8;
      auVar26 = vshufpd_avx(auVar80,auVar80,1);
      auVar74._0_4_ = auVar80._0_4_ + auVar26._0_4_;
      auVar74._4_4_ = auVar80._4_4_ + auVar26._4_4_;
      auVar74._8_4_ = auVar80._8_4_ + auVar26._8_4_;
      auVar74._12_4_ = auVar80._12_4_ + auVar26._12_4_;
      auVar26 = vhaddps_avx(auVar74,auVar74);
      auVar75 = vpblendd_avx2((undefined1  [16])0x0,*(undefined1 (*) [16])(blk->data_mean).m,7);
      auVar58 = vshufpd_avx(auVar66,auVar66,1);
      auVar67._0_4_ = auVar58._0_4_ + auVar66._0_4_;
      auVar67._4_4_ = auVar58._4_4_ + auVar66._4_4_;
      auVar67._8_4_ = auVar58._8_4_ + auVar66._8_4_;
      auVar67._12_4_ = auVar58._12_4_ + auVar66._12_4_;
      auVar58 = vhaddps_avx(auVar67,auVar67);
      auVar14 = vshufpd_avx(auVar44,auVar44,1);
      auVar45._0_4_ = auVar14._0_4_ + auVar44._0_4_;
      auVar45._4_4_ = auVar14._4_4_ + auVar44._4_4_;
      auVar45._8_4_ = auVar14._8_4_ + auVar44._8_4_;
      auVar45._12_4_ = auVar14._12_4_ + auVar44._12_4_;
      auVar14 = vhaddps_avx(auVar45,auVar45);
      auVar49._0_4_ = fVar57 * auVar75._0_4_;
      auVar49._4_4_ = fVar57 * auVar75._4_4_;
      auVar49._8_4_ = fVar57 * auVar75._8_4_;
      auVar49._12_4_ = fVar57 * auVar75._12_4_;
      auVar75 = vshufpd_avx(auVar37,auVar37,1);
      auVar38._0_4_ = auVar37._0_4_ + auVar75._0_4_;
      auVar38._4_4_ = auVar37._4_4_ + auVar75._4_4_;
      auVar38._8_4_ = auVar37._8_4_ + auVar75._8_4_;
      auVar38._12_4_ = auVar37._12_4_ + auVar75._12_4_;
      auVar75 = vhaddps_avx(auVar38,auVar38);
      auVar15 = vshufpd_avx(auVar21,auVar21,1);
      auVar22._0_4_ = auVar21._0_4_ + auVar15._0_4_;
      auVar22._4_4_ = auVar21._4_4_ + auVar15._4_4_;
      auVar22._8_4_ = auVar21._8_4_ + auVar15._8_4_;
      auVar22._12_4_ = auVar21._12_4_ + auVar15._12_4_;
      auVar15 = vhaddps_avx(auVar22,auVar22);
      auVar26 = vinsertps_avx(auVar26,auVar58,0x1c);
      auVar26 = vblendps_avx(auVar26,auVar14,4);
      auVar14 = vinsertps_avx(auVar75,auVar15,0x1c);
      auVar58 = vshufpd_avx(auVar12,auVar12,1);
      auVar13._0_4_ = auVar12._0_4_ + auVar58._0_4_;
      auVar13._4_4_ = auVar12._4_4_ + auVar58._4_4_;
      auVar13._8_4_ = auVar12._8_4_ + auVar58._8_4_;
      auVar13._12_4_ = auVar12._12_4_ + auVar58._12_4_;
      auVar58 = vhaddps_avx(auVar13,auVar13);
      fVar57 = (float)pi->partition_texel_count[0];
      auVar58 = vblendps_avx(auVar14,auVar58,4);
      auVar23._4_4_ = fVar57;
      auVar23._0_4_ = fVar57;
      auVar23._8_4_ = fVar57;
      auVar23._12_4_ = fVar57;
      local_98 = vdivps_avx(auVar26,auVar23);
      auVar24._0_4_ = (float)pi->partition_texel_count[1];
      auVar26 = vsubps_avx(auVar49,auVar26);
      auVar24._4_4_ = auVar24._0_4_;
      auVar24._8_4_ = auVar24._0_4_;
      auVar24._12_4_ = auVar24._0_4_;
      local_88 = vdivps_avx(auVar58,auVar24);
      auVar25._0_4_ = (float)pi->partition_texel_count[2];
      auVar26 = vsubps_avx(auVar26,auVar58);
      auVar25._4_4_ = auVar25._0_4_;
      auVar25._8_4_ = auVar25._0_4_;
      auVar25._12_4_ = auVar25._0_4_;
      local_78 = vdivps_avx(auVar26,auVar25);
    }
    else {
      local_28[4] = bVar1;
      local_28._0_4_ = uVar8;
      local_28._5_3_ = 0;
      local_28[8] = bVar1;
      local_28._9_3_ = 0;
      local_28[0xc] = bVar1;
      local_28._13_3_ = 0;
      local_28[0x10] = bVar1;
      local_28._17_3_ = 0;
      local_28[0x14] = bVar1;
      local_28._21_3_ = 0;
      local_28[0x18] = bVar1;
      local_28._25_3_ = 0;
      local_28[0x1c] = bVar1;
      local_28._29_3_ = 0;
      auVar4 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      local_48 = 8;
      uStack_44 = 8;
      uStack_40 = 8;
      uStack_3c = 8;
      uStack_38 = 8;
      uStack_34 = 8;
      uStack_30 = 8;
      uStack_2c = 8;
      local_58 = 1;
      uStack_57 = 1;
      uStack_56 = 1;
      uStack_55 = 1;
      uStack_54 = 1;
      uStack_53 = 1;
      uStack_52 = 1;
      uStack_51 = 1;
      uStack_50 = 1;
      uStack_4f = 1;
      uStack_4e = 1;
      uStack_4d = 1;
      uStack_4c = 1;
      uStack_4b = 1;
      uStack_4a = 1;
      uStack_49 = 1;
      uVar10 = 0;
      auVar85[8] = 2;
      auVar85._0_8_ = 0x202020202020202;
      auVar85[9] = 2;
      auVar85[10] = 2;
      auVar85[0xb] = 2;
      auVar85[0xc] = 2;
      auVar85[0xd] = 2;
      auVar85[0xe] = 2;
      auVar85[0xf] = 2;
      auVar84 = ZEXT816(0) << 0x40;
      auVar81 = ZEXT816(0);
      auVar68 = ZEXT816(0);
      auVar59 = ZEXT816(0);
      auVar51 = ZEXT816(0) << 0x40;
      auVar46 = ZEXT816(0);
      auVar40 = ZEXT816(0);
      auVar30 = ZEXT816(0);
      auVar16 = (undefined1  [16])0x0;
      do {
        auVar43 = vpcmpgtd_avx2(local_28,auVar4);
        auVar86._8_8_ = 0;
        auVar86._0_8_ = *(ulong *)(pi->partition_of_texel + uVar10);
        auVar26 = vpcmpeqb_avx(auVar86,_DAT_00277060);
        auVar73 = vpmovsxbd_avx2(auVar26);
        auVar73 = vpand_avx2(auVar43,auVar73);
        auVar6[8] = 1;
        auVar6._0_8_ = 0x101010101010101;
        auVar6[9] = 1;
        auVar6[10] = 1;
        auVar6[0xb] = 1;
        auVar6[0xc] = 1;
        auVar6[0xd] = 1;
        auVar6[0xe] = 1;
        auVar6[0xf] = 1;
        auVar26 = vpcmpeqb_avx(auVar86,auVar6);
        auVar5 = vpmovsxbd_avx2(auVar26);
        auVar5 = vpand_avx2(auVar5,auVar43);
        auVar87._8_8_ = 0;
        auVar87._0_8_ = *(ulong *)(pi->partition_of_texel + uVar10);
        auVar26 = vpcmpeqb_avx(auVar87,auVar85);
        auVar56 = vpmovsxbd_avx2(auVar26);
        auVar56 = vpand_avx2(auVar56,auVar43);
        auVar43 = *(undefined1 (*) [32])(blk->data_r + uVar10);
        auVar77 = vpand_avx2(auVar43,auVar73);
        fVar57 = auVar84._4_4_;
        fVar19 = auVar84._8_4_;
        fVar20 = auVar84._12_4_;
        auVar84._0_4_ = auVar77._16_4_ + auVar84._0_4_ + auVar77._0_4_;
        auVar84._4_4_ = auVar77._20_4_ + fVar57 + auVar77._4_4_;
        auVar84._8_4_ = auVar77._24_4_ + fVar19 + auVar77._8_4_;
        auVar84._12_4_ = auVar77._28_4_ + fVar20 + auVar77._12_4_;
        auVar77 = vpand_avx2(auVar5,auVar43);
        fVar57 = auVar59._4_4_;
        fVar19 = auVar59._8_4_;
        fVar20 = auVar59._12_4_;
        auVar59._0_4_ = auVar77._16_4_ + auVar77._0_4_ + auVar59._0_4_;
        auVar59._4_4_ = auVar77._20_4_ + auVar77._4_4_ + fVar57;
        auVar59._8_4_ = auVar77._24_4_ + auVar77._8_4_ + fVar19;
        auVar59._12_4_ = auVar77._28_4_ + auVar77._12_4_ + fVar20;
        auVar43 = vpand_avx2(auVar56,auVar43);
        fVar57 = auVar40._4_4_;
        fVar19 = auVar40._8_4_;
        fVar20 = auVar40._12_4_;
        auVar40._0_4_ = auVar43._16_4_ + auVar43._0_4_ + auVar40._0_4_;
        auVar40._4_4_ = auVar43._20_4_ + auVar43._4_4_ + fVar57;
        auVar40._8_4_ = auVar43._24_4_ + auVar43._8_4_ + fVar19;
        auVar40._12_4_ = auVar43._28_4_ + auVar43._12_4_ + fVar20;
        auVar43 = *(undefined1 (*) [32])(blk->data_g + uVar10);
        auVar77 = vpand_avx2(auVar43,auVar73);
        fVar57 = auVar81._4_4_;
        fVar19 = auVar81._8_4_;
        fVar20 = auVar81._12_4_;
        auVar81._0_4_ = auVar77._16_4_ + auVar81._0_4_ + auVar77._0_4_;
        auVar81._4_4_ = auVar77._20_4_ + fVar57 + auVar77._4_4_;
        auVar81._8_4_ = auVar77._24_4_ + fVar19 + auVar77._8_4_;
        auVar81._12_4_ = auVar77._28_4_ + fVar20 + auVar77._12_4_;
        auVar77 = vpand_avx2(auVar5,auVar43);
        fVar57 = auVar51._4_4_;
        fVar19 = auVar51._8_4_;
        fVar20 = auVar51._12_4_;
        auVar51._0_4_ = auVar77._16_4_ + auVar77._0_4_ + auVar51._0_4_;
        auVar51._4_4_ = auVar77._20_4_ + auVar77._4_4_ + fVar57;
        auVar51._8_4_ = auVar77._24_4_ + auVar77._8_4_ + fVar19;
        auVar51._12_4_ = auVar77._28_4_ + auVar77._12_4_ + fVar20;
        auVar43 = vpand_avx2(auVar56,auVar43);
        fVar57 = auVar30._4_4_;
        fVar19 = auVar30._8_4_;
        fVar20 = auVar30._12_4_;
        auVar30._0_4_ = auVar43._16_4_ + auVar43._0_4_ + auVar30._0_4_;
        auVar30._4_4_ = auVar43._20_4_ + auVar43._4_4_ + fVar57;
        auVar30._8_4_ = auVar43._24_4_ + auVar43._8_4_ + fVar19;
        auVar30._12_4_ = auVar43._28_4_ + auVar43._12_4_ + fVar20;
        auVar43 = *(undefined1 (*) [32])(blk->data_b + uVar10);
        auVar73 = vpand_avx2(auVar43,auVar73);
        fVar57 = auVar68._4_4_;
        fVar19 = auVar68._8_4_;
        fVar20 = auVar68._12_4_;
        auVar68._0_4_ = auVar73._16_4_ + auVar68._0_4_ + auVar73._0_4_;
        auVar68._4_4_ = auVar73._20_4_ + fVar57 + auVar73._4_4_;
        auVar68._8_4_ = auVar73._24_4_ + fVar19 + auVar73._8_4_;
        auVar68._12_4_ = auVar73._28_4_ + fVar20 + auVar73._12_4_;
        auVar73 = vpand_avx2(auVar5,auVar43);
        fVar57 = auVar46._4_4_;
        fVar19 = auVar46._8_4_;
        fVar20 = auVar46._12_4_;
        auVar46._0_4_ = auVar73._16_4_ + auVar46._0_4_ + auVar73._0_4_;
        auVar46._4_4_ = auVar73._20_4_ + fVar57 + auVar73._4_4_;
        auVar46._8_4_ = auVar73._24_4_ + fVar19 + auVar73._8_4_;
        auVar46._12_4_ = auVar73._28_4_ + fVar20 + auVar73._12_4_;
        auVar43 = vpand_avx2(auVar56,auVar43);
        fVar57 = auVar16._4_4_;
        fVar19 = auVar16._8_4_;
        fVar20 = auVar16._12_4_;
        auVar16._0_4_ = auVar43._16_4_ + auVar16._0_4_ + auVar43._0_4_;
        auVar16._4_4_ = auVar43._20_4_ + fVar57 + auVar43._4_4_;
        auVar16._8_4_ = auVar43._24_4_ + fVar19 + auVar43._8_4_;
        auVar16._12_4_ = auVar43._28_4_ + fVar20 + auVar43._12_4_;
        auVar5._8_4_ = 8;
        auVar5._0_8_ = 0x800000008;
        auVar5._12_4_ = 8;
        auVar5._16_4_ = 8;
        auVar5._20_4_ = 8;
        auVar5._24_4_ = 8;
        auVar5._28_4_ = 8;
        auVar4 = vpaddd_avx2(auVar4,auVar5);
        uVar10 = uVar10 + 8;
      } while (uVar10 < uVar11);
      fVar57 = (float)uVar8;
      auVar26 = vshufpd_avx(auVar84,auVar84,1);
      auVar79._0_4_ = auVar84._0_4_ + auVar26._0_4_;
      auVar79._4_4_ = auVar84._4_4_ + auVar26._4_4_;
      auVar79._8_4_ = auVar84._8_4_ + auVar26._8_4_;
      auVar79._12_4_ = auVar84._12_4_ + auVar26._12_4_;
      auVar26 = vhaddps_avx(auVar79,auVar79);
      auVar58 = vshufpd_avx(auVar81,auVar81,1);
      auVar82._0_4_ = auVar81._0_4_ + auVar58._0_4_;
      auVar82._4_4_ = auVar81._4_4_ + auVar58._4_4_;
      auVar82._8_4_ = auVar81._8_4_ + auVar58._8_4_;
      auVar82._12_4_ = auVar81._12_4_ + auVar58._12_4_;
      auVar58 = vhaddps_avx(auVar82,auVar82);
      auVar15 = vpblendd_avx2((undefined1  [16])0x0,*(undefined1 (*) [16])(blk->data_mean).m,7);
      auVar14 = vshufpd_avx(auVar68,auVar68,1);
      auVar69._0_4_ = auVar14._0_4_ + auVar68._0_4_;
      auVar69._4_4_ = auVar14._4_4_ + auVar68._4_4_;
      auVar69._8_4_ = auVar14._8_4_ + auVar68._8_4_;
      auVar69._12_4_ = auVar14._12_4_ + auVar68._12_4_;
      auVar14 = vhaddps_avx(auVar69,auVar69);
      auVar75 = vshufpd_avx(auVar59,auVar59,1);
      auVar60._0_4_ = auVar75._0_4_ + auVar59._0_4_;
      auVar60._4_4_ = auVar75._4_4_ + auVar59._4_4_;
      auVar60._8_4_ = auVar75._8_4_ + auVar59._8_4_;
      auVar60._12_4_ = auVar75._12_4_ + auVar59._12_4_;
      auVar75 = vhaddps_avx(auVar60,auVar60);
      auVar61._0_4_ = auVar15._0_4_ * fVar57;
      auVar61._4_4_ = auVar15._4_4_ * fVar57;
      auVar61._8_4_ = auVar15._8_4_ * fVar57;
      auVar61._12_4_ = auVar15._12_4_ * fVar57;
      auVar15 = vshufpd_avx(auVar51,auVar51,1);
      auVar52._0_4_ = auVar51._0_4_ + auVar15._0_4_;
      auVar52._4_4_ = auVar51._4_4_ + auVar15._4_4_;
      auVar52._8_4_ = auVar51._8_4_ + auVar15._8_4_;
      auVar52._12_4_ = auVar51._12_4_ + auVar15._12_4_;
      auVar15 = vhaddps_avx(auVar52,auVar52);
      auVar27 = vshufpd_avx(auVar46,auVar46,1);
      auVar47._0_4_ = auVar46._0_4_ + auVar27._0_4_;
      auVar47._4_4_ = auVar46._4_4_ + auVar27._4_4_;
      auVar47._8_4_ = auVar46._8_4_ + auVar27._8_4_;
      auVar47._12_4_ = auVar46._12_4_ + auVar27._12_4_;
      auVar27 = vhaddps_avx(auVar47,auVar47);
      auVar26 = vinsertps_avx(auVar26,auVar58,0x1c);
      auVar26 = vblendps_avx(auVar26,auVar14,4);
      auVar58 = vshufpd_avx(auVar40,auVar40,1);
      auVar41._0_4_ = auVar40._0_4_ + auVar58._0_4_;
      auVar41._4_4_ = auVar40._4_4_ + auVar58._4_4_;
      auVar41._8_4_ = auVar40._8_4_ + auVar58._8_4_;
      auVar41._12_4_ = auVar40._12_4_ + auVar58._12_4_;
      auVar14 = vhaddps_avx(auVar41,auVar41);
      auVar58 = vshufpd_avx(auVar30,auVar30,1);
      auVar31._0_4_ = auVar30._0_4_ + auVar58._0_4_;
      auVar31._4_4_ = auVar30._4_4_ + auVar58._4_4_;
      auVar31._8_4_ = auVar30._8_4_ + auVar58._8_4_;
      auVar31._12_4_ = auVar30._12_4_ + auVar58._12_4_;
      auVar28 = vhaddps_avx(auVar31,auVar31);
      auVar58 = vinsertps_avx(auVar75,auVar15,0x1c);
      auVar58 = vblendps_avx(auVar58,auVar27,4);
      auVar75 = vinsertps_avx(auVar14,auVar28,0x1c);
      auVar14 = vshufpd_avx(auVar16,auVar16,1);
      auVar17._0_4_ = auVar16._0_4_ + auVar14._0_4_;
      auVar17._4_4_ = auVar16._4_4_ + auVar14._4_4_;
      auVar17._8_4_ = auVar16._8_4_ + auVar14._8_4_;
      auVar17._12_4_ = auVar16._12_4_ + auVar14._12_4_;
      auVar14 = vhaddps_avx(auVar17,auVar17);
      fVar57 = (float)pi->partition_texel_count[0];
      auVar14 = vblendps_avx(auVar75,auVar14,4);
      auVar32._4_4_ = fVar57;
      auVar32._0_4_ = fVar57;
      auVar32._8_4_ = fVar57;
      auVar32._12_4_ = fVar57;
      local_98 = vdivps_avx(auVar26,auVar32);
      auVar33._0_4_ = (float)pi->partition_texel_count[1];
      auVar26 = vsubps_avx(auVar61,auVar26);
      auVar33._4_4_ = auVar33._0_4_;
      auVar33._8_4_ = auVar33._0_4_;
      auVar33._12_4_ = auVar33._0_4_;
      local_88 = vdivps_avx(auVar58,auVar33);
      auVar34._0_4_ = (float)pi->partition_texel_count[2];
      auVar26 = vsubps_avx(auVar26,auVar58);
      auVar34._4_4_ = auVar34._0_4_;
      auVar34._8_4_ = auVar34._0_4_;
      auVar34._12_4_ = auVar34._0_4_;
      local_78 = vdivps_avx(auVar14,auVar34);
      auVar35._0_4_ = (float)pi->partition_texel_count[3];
      auVar26 = vsubps_avx(auVar26,auVar14);
      auVar35._4_4_ = auVar35._0_4_;
      auVar35._8_4_ = auVar35._0_4_;
      auVar35._12_4_ = auVar35._0_4_;
      local_68 = vdivps_avx(auVar26,auVar35);
    }
  }
  pauVar9 = pi->texels_of_partition;
  uVar11 = 0;
  do {
    bVar1 = pi->partition_texel_count[uVar11];
    if ((ulong)bVar1 == 0) {
      __assert_fail("texel_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                    ,0x248,
                    "void compute_avgs_and_dirs_3_comp_rgb(const partition_info &, const image_block &, partition_metrics *)"
                   );
    }
    auVar26 = *(undefined1 (*) [16])(local_98 + uVar11 * 0x10);
    *(undefined1 (*) [16])pm[uVar11].avg.m = auVar26;
    uVar10 = 0;
    auVar58 = ZEXT816(0) << 0x40;
    auVar14 = ZEXT816(0) << 0x40;
    auVar75 = ZEXT816(0) << 0x40;
    do {
      bVar2 = (*pauVar9)[uVar10];
      auVar15 = vinsertps_avx(ZEXT416((uint)blk->data_r[bVar2]),ZEXT416((uint)blk->data_g[bVar2]),
                              0x1c);
      auVar15 = vinsertps_avx(auVar15,ZEXT416((uint)blk->data_b[bVar2]),0x28);
      auVar28 = vsubps_avx(auVar15,auVar26);
      auVar27 = vcmpps_avx(ZEXT816(0) << 0x40,auVar28,1);
      uVar65 = auVar27._0_4_;
      auVar76._4_4_ = uVar65;
      auVar76._0_4_ = uVar65;
      auVar76._8_4_ = uVar65;
      auVar76._12_4_ = uVar65;
      auVar15 = vandps_avx(auVar76,auVar28);
      auVar36._0_4_ = auVar58._0_4_ + auVar15._0_4_;
      auVar36._4_4_ = auVar58._4_4_ + auVar15._4_4_;
      auVar36._8_4_ = auVar58._8_4_ + auVar15._8_4_;
      auVar36._12_4_ = auVar58._12_4_ + auVar15._12_4_;
      auVar58 = vshufps_avx(auVar27,auVar27,0x55);
      auVar58 = vandps_avx(auVar58,auVar28);
      auVar48._0_4_ = auVar14._0_4_ + auVar58._0_4_;
      auVar48._4_4_ = auVar14._4_4_ + auVar58._4_4_;
      auVar48._8_4_ = auVar14._8_4_ + auVar58._8_4_;
      auVar48._12_4_ = auVar14._12_4_ + auVar58._12_4_;
      auVar58 = vshufps_avx(auVar27,auVar27,0xaa);
      auVar58 = vandps_avx(auVar58,auVar28);
      auVar42._0_4_ = auVar75._0_4_ + auVar58._0_4_;
      auVar42._4_4_ = auVar75._4_4_ + auVar58._4_4_;
      auVar42._8_4_ = auVar75._8_4_ + auVar58._8_4_;
      auVar42._12_4_ = auVar75._12_4_ + auVar58._12_4_;
      uVar10 = uVar10 + 1;
      auVar58 = auVar36;
      auVar14 = auVar48;
      auVar75 = auVar42;
    } while (bVar1 != uVar10);
    auVar53._0_4_ = auVar36._0_4_ * auVar36._0_4_;
    auVar53._4_4_ = auVar36._4_4_ * auVar36._4_4_;
    auVar53._8_4_ = auVar36._8_4_ * auVar36._8_4_;
    auVar53._12_4_ = auVar36._12_4_ * auVar36._12_4_;
    auVar26 = vshufpd_avx(auVar53,auVar53,1);
    auVar54._0_4_ = auVar53._0_4_ + auVar26._0_4_;
    auVar54._4_4_ = auVar53._4_4_ + auVar26._4_4_;
    auVar54._8_4_ = auVar53._8_4_ + auVar26._8_4_;
    auVar54._12_4_ = auVar53._12_4_ + auVar26._12_4_;
    auVar26 = vhaddps_avx(auVar54,auVar54);
    auVar62._0_4_ = auVar48._0_4_ * auVar48._0_4_;
    auVar62._4_4_ = auVar48._4_4_ * auVar48._4_4_;
    auVar62._8_4_ = auVar48._8_4_ * auVar48._8_4_;
    auVar62._12_4_ = auVar48._12_4_ * auVar48._12_4_;
    auVar58 = vshufpd_avx(auVar62,auVar62,1);
    auVar63._0_4_ = auVar62._0_4_ + auVar58._0_4_;
    auVar63._4_4_ = auVar62._4_4_ + auVar58._4_4_;
    auVar63._8_4_ = auVar62._8_4_ + auVar58._8_4_;
    auVar63._12_4_ = auVar62._12_4_ + auVar58._12_4_;
    auVar58 = vhaddps_avx(auVar63,auVar63);
    auVar55._0_4_ = auVar26._0_4_;
    auVar55._4_4_ = auVar55._0_4_;
    auVar55._8_4_ = auVar55._0_4_;
    auVar55._12_4_ = auVar55._0_4_;
    auVar64._0_4_ = auVar58._0_4_;
    auVar64._4_4_ = auVar64._0_4_;
    auVar64._8_4_ = auVar64._0_4_;
    auVar64._12_4_ = auVar64._0_4_;
    auVar70._0_4_ = auVar42._0_4_ * auVar42._0_4_;
    auVar70._4_4_ = auVar42._4_4_ * auVar42._4_4_;
    auVar70._8_4_ = auVar42._8_4_ * auVar42._8_4_;
    auVar70._12_4_ = auVar42._12_4_ * auVar42._12_4_;
    auVar26 = vshufpd_avx(auVar70,auVar70,1);
    auVar71._0_4_ = auVar70._0_4_ + auVar26._0_4_;
    auVar71._4_4_ = auVar70._4_4_ + auVar26._4_4_;
    auVar71._8_4_ = auVar70._8_4_ + auVar26._8_4_;
    auVar71._12_4_ = auVar70._12_4_ + auVar26._12_4_;
    auVar26 = vhaddps_avx(auVar71,auVar71);
    auVar72._0_4_ = auVar26._0_4_;
    auVar72._4_4_ = auVar72._0_4_;
    auVar72._8_4_ = auVar72._0_4_;
    auVar72._12_4_ = auVar72._0_4_;
    auVar26 = vcmpps_avx(auVar55,auVar64,1);
    auVar26 = vblendvps_avx(auVar36,auVar48,auVar26);
    auVar58 = vmaxps_avx(auVar64,auVar55);
    auVar58 = vcmpps_avx(auVar58,auVar72,1);
    auVar26 = vblendvps_avx(auVar26,auVar42,auVar58);
    *(undefined1 (*) [16])pm[uVar11].dir.m = auVar26;
    uVar11 = uVar11 + 1;
    pauVar9 = pauVar9 + 1;
  } while (uVar11 != uVar7);
  return;
}

Assistant:

void compute_avgs_and_dirs_3_comp_rgb(
	const partition_info& pi,
	const image_block& blk,
	partition_metrics pm[BLOCK_MAX_PARTITIONS]
) {
	unsigned int partition_count = pi.partition_count;
	promise(partition_count > 0);

	// Pre-compute partition_averages
	vfloat4 partition_averages[BLOCK_MAX_PARTITIONS];
	compute_partition_averages_rgb(pi, blk, partition_averages);

	for (unsigned int partition = 0; partition < partition_count; partition++)
	{
		const uint8_t *texel_indexes = pi.texels_of_partition[partition];
		unsigned int texel_count = pi.partition_texel_count[partition];
		promise(texel_count > 0);

		vfloat4 average = partition_averages[partition];
		pm[partition].avg = average;

		vfloat4 sum_xp = vfloat4::zero();
		vfloat4 sum_yp = vfloat4::zero();
		vfloat4 sum_zp = vfloat4::zero();

		for (unsigned int i = 0; i < texel_count; i++)
		{
			unsigned int iwt = texel_indexes[i];

			vfloat4 texel_datum = blk.texel3(iwt);
			texel_datum = texel_datum - average;

			vfloat4 zero = vfloat4::zero();

			vmask4 tdm0 = texel_datum.swz<0,0,0,0>() > zero;
			sum_xp += select(zero, texel_datum, tdm0);

			vmask4 tdm1 = texel_datum.swz<1,1,1,1>() > zero;
			sum_yp += select(zero, texel_datum, tdm1);

			vmask4 tdm2 = texel_datum.swz<2,2,2,2>() > zero;
			sum_zp += select(zero, texel_datum, tdm2);
		}

		vfloat4 prod_xp = dot(sum_xp, sum_xp);
		vfloat4 prod_yp = dot(sum_yp, sum_yp);
		vfloat4 prod_zp = dot(sum_zp, sum_zp);

		vfloat4 best_vector = sum_xp;
		vfloat4 best_sum = prod_xp;

		vmask4 mask = prod_yp > best_sum;
		best_vector = select(best_vector, sum_yp, mask);
		best_sum = select(best_sum, prod_yp, mask);

		mask = prod_zp > best_sum;
		best_vector = select(best_vector, sum_zp, mask);

		pm[partition].dir = best_vector;
	}
}